

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

PageAllocation * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocAllocation(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *this,size_t pageCount)

{
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *in_RAX;
  PageAllocation *pPVar1;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *local_18;
  
  if (this->maxAllocPageCount < pageCount) {
    local_18 = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
               AllocSegment(this,pageCount);
    if (local_18 == (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      return (PageAllocation *)0x0;
    }
    pPVar1 = (PageAllocation *)
             (local_18->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
    pPVar1->pageCount =
         (local_18->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount -
         (ulong)(local_18->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                secondaryAllocPageCount;
  }
  else {
    local_18 = in_RAX;
    pPVar1 = (PageAllocation *)AllocPages(this,(uint)pageCount,&local_18);
    if (pPVar1 == (PageAllocation *)0x0) {
      return (PageAllocation *)0x0;
    }
    pPVar1->pageCount = pageCount;
  }
  pPVar1->segment = local_18;
  return pPVar1;
}

Assistant:

PageAllocation *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocAllocation(size_t pageCount)
{
    PageAllocation * pageAllocation;
    TSegment * segment;
    if (pageCount > this->maxAllocPageCount)
    {
        // We need some space reserved for secondary allocations
        segment = AllocSegment(pageCount);
        if (segment == nullptr)
        {
            return nullptr;
        }
        pageAllocation = (PageAllocation *)segment->GetAddress();
        pageAllocation->pageCount = segment->GetAvailablePageCount();
    }
    else
    {
        Assert(pageCount <= UINT_MAX);
        pageAllocation = (PageAllocation *)AllocPages((uint)pageCount, (TPageSegment **)&segment);
        if (pageAllocation == nullptr)
        {
            return nullptr;
        }
        pageAllocation->pageCount = pageCount;
    }
    pageAllocation->segment = segment;

    return pageAllocation;
}